

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void power(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  char *pcVar3;
  size_t sVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  TokenType TVar8;
  Token *pTVar9;
  uint8_t instruction;
  Scanner *scanner;
  Token local_60;
  Token *local_40;
  Scanner *local_38;
  
  primary(vm);
  pCVar1 = &vm->compiler;
  pTVar9 = &(vm->compiler).previous;
  pTVar2 = &(vm->compiler).next;
  local_38 = &(vm->compiler).scanner;
  TVar8 = (vm->compiler).token.type;
  scanner = local_38;
  local_40 = pTVar9;
  while( true ) {
    while (0x28 < (int)TVar8) {
      if (TVar8 == TOKEN_DOT) {
        do {
          TVar8 = (pCVar1->token).type;
          uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar3 = (vm->compiler).token.start;
          uVar5 = (vm->compiler).token.line;
          uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          pTVar9->length = (vm->compiler).token.length;
          pTVar9->line = uVar5;
          *(undefined4 *)&pTVar9->field_0x1c = uVar6;
          pTVar9->type = TVar8;
          *(undefined4 *)&pTVar9->field_0x4 = uVar7;
          pTVar9->start = pcVar3;
          uVar6 = *(undefined4 *)&pTVar2->field_0x4;
          pcVar3 = (vm->compiler).next.start;
          sVar4 = (vm->compiler).next.length;
          uVar5 = (vm->compiler).next.line;
          uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = pTVar2->type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
          (vm->compiler).token.start = pcVar3;
          (vm->compiler).token.length = sVar4;
          (vm->compiler).token.line = uVar5;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
          scan_token(&local_60,scanner);
          *(undefined4 *)&(vm->compiler).next.length = (undefined4)local_60.length;
          *(undefined4 *)((long)&(vm->compiler).next.length + 4) = local_60.length._4_4_;
          (vm->compiler).next.line = local_60.line;
          *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
          pTVar2->type = local_60.type;
          *(undefined4 *)&(vm->compiler).next.field_0x4 = local_60._4_4_;
          *(undefined4 *)&(vm->compiler).next.start = local_60.start._0_4_;
          *(undefined4 *)((long)&(vm->compiler).next.start + 4) = local_60.start._4_4_;
          if ((pCVar1->token).type != TOKEN_IDENTIFIER) {
            printf("[Line %d] %s\n",
                   (ulong)(vm->compiler).scope[(ulong)(pTVar9->type != TOKEN_ERROR) * 2 + -8].cap,
                   "Expected identifier after \'.\'");
            longjmp((__jmp_buf_tag *)error_buf,2);
          }
          string(vm,false);
          TVar8 = (pCVar1->token).type;
          uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar3 = (vm->compiler).token.start;
          uVar5 = (vm->compiler).token.line;
          uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          pTVar9->length = (vm->compiler).token.length;
          pTVar9->line = uVar5;
          *(undefined4 *)&pTVar9->field_0x1c = uVar6;
          pTVar9->type = TVar8;
          *(undefined4 *)&pTVar9->field_0x4 = uVar7;
          pTVar9->start = pcVar3;
          uVar6 = *(undefined4 *)&pTVar2->field_0x4;
          pcVar3 = (vm->compiler).next.start;
          sVar4 = (vm->compiler).next.length;
          uVar5 = (vm->compiler).next.line;
          uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = pTVar2->type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
          (vm->compiler).token.start = pcVar3;
          (vm->compiler).token.length = sVar4;
          (vm->compiler).token.line = uVar5;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
          scan_token(&local_60,scanner);
          (vm->compiler).next.length = CONCAT44(local_60.length._4_4_,(undefined4)local_60.length);
          *(ulong *)&(vm->compiler).next.line = CONCAT44(local_60._28_4_,local_60.line);
          *(ulong *)pTVar2 = CONCAT44(local_60._4_4_,local_60.type);
          (vm->compiler).next.start = (char *)CONCAT44(local_60.start._4_4_,local_60.start._0_4_);
          handle_struct_assign(vm);
          TVar8 = (vm->compiler).token.type;
        } while (TVar8 == TOKEN_DOT);
      }
      else {
        if (TVar8 != TOKEN_OPEN_BRACKET) {
          return;
        }
        do {
          TVar8 = (pCVar1->token).type;
          uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
          pcVar3 = (vm->compiler).token.start;
          uVar5 = (vm->compiler).token.line;
          uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
          pTVar9->length = (vm->compiler).token.length;
          pTVar9->line = uVar5;
          *(undefined4 *)&pTVar9->field_0x1c = uVar6;
          pTVar9->type = TVar8;
          *(undefined4 *)&pTVar9->field_0x4 = uVar7;
          pTVar9->start = pcVar3;
          uVar6 = *(undefined4 *)&pTVar2->field_0x4;
          pcVar3 = (vm->compiler).next.start;
          sVar4 = (vm->compiler).next.length;
          uVar5 = (vm->compiler).next.line;
          uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
          (pCVar1->token).type = pTVar2->type;
          *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
          (vm->compiler).token.start = pcVar3;
          (vm->compiler).token.length = sVar4;
          (vm->compiler).token.line = uVar5;
          *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
          scan_token(&local_60,scanner);
          (vm->compiler).next.length = CONCAT44(local_60.length._4_4_,(undefined4)local_60.length);
          *(ulong *)&(vm->compiler).next.line = CONCAT44(local_60._28_4_,local_60.line);
          *(ulong *)pTVar2 = CONCAT44(local_60._4_4_,local_60.type);
          (vm->compiler).next.start = (char *)CONCAT44(local_60.start._4_4_,local_60.start._0_4_);
          expr(vm);
          consume(&local_60,vm,TOKEN_CLOSE_BRACKET,"Expected \']\' after expression");
          handle_struct_assign(vm);
          TVar8 = (vm->compiler).token.type;
        } while (TVar8 == TOKEN_OPEN_BRACKET);
      }
    }
    if (TVar8 != TOKEN_OPEN_PAREN) break;
    do {
      TVar8 = (pCVar1->token).type;
      uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar3 = (vm->compiler).token.start;
      uVar5 = (vm->compiler).token.line;
      uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      pTVar9->length = (vm->compiler).token.length;
      pTVar9->line = uVar5;
      *(undefined4 *)&pTVar9->field_0x1c = uVar6;
      pTVar9->type = TVar8;
      *(undefined4 *)&pTVar9->field_0x4 = uVar7;
      pTVar9->start = pcVar3;
      uVar6 = *(undefined4 *)&pTVar2->field_0x4;
      pcVar3 = (vm->compiler).next.start;
      sVar4 = (vm->compiler).next.length;
      uVar5 = (vm->compiler).next.line;
      uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = pTVar2->type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
      (vm->compiler).token.start = pcVar3;
      (vm->compiler).token.length = sVar4;
      (vm->compiler).token.line = uVar5;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
      scan_token(&local_60,scanner);
      (vm->compiler).next.length = CONCAT44(local_60.length._4_4_,(undefined4)local_60.length);
      *(ulong *)&(vm->compiler).next.line = CONCAT44(local_60._28_4_,local_60.line);
      *(ulong *)pTVar2 = CONCAT44(local_60._4_4_,local_60.type);
      (vm->compiler).next.start = (char *)CONCAT44(local_60.start._4_4_,local_60.start._0_4_);
      if ((pCVar1->token).type == TOKEN_CLOSE_PAREN) {
        TVar8 = (pCVar1->token).type;
        uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
        pcVar3 = (vm->compiler).token.start;
        uVar5 = (vm->compiler).token.line;
        uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        pTVar9->length = (vm->compiler).token.length;
        pTVar9->line = uVar5;
        *(undefined4 *)&pTVar9->field_0x1c = uVar6;
        pTVar9->type = TVar8;
        *(undefined4 *)&pTVar9->field_0x4 = uVar7;
        pTVar9->start = pcVar3;
        uVar6 = *(undefined4 *)&pTVar2->field_0x4;
        pcVar3 = (vm->compiler).next.start;
        sVar4 = (vm->compiler).next.length;
        uVar5 = (vm->compiler).next.line;
        uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (pCVar1->token).type = pTVar2->type;
        *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
        (vm->compiler).token.start = pcVar3;
        (vm->compiler).token.length = sVar4;
        (vm->compiler).token.line = uVar5;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
        scan_token(&local_60,scanner);
        (vm->compiler).next.length = CONCAT44(local_60.length._4_4_,(undefined4)local_60.length);
        *(ulong *)&(vm->compiler).next.line = CONCAT44(local_60._28_4_,local_60.line);
        *(ulong *)pTVar2 = CONCAT44(local_60._4_4_,local_60.type);
        (vm->compiler).next.start = (char *)CONCAT44(local_60.start._4_4_,local_60.start._0_4_);
        instruction = '\0';
      }
      else {
        expr(vm);
        instruction = '\x01';
        if ((vm->compiler).token.type == TOKEN_COMMA) {
          instruction = '\x01';
          do {
            TVar8 = (pCVar1->token).type;
            uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
            pcVar3 = (vm->compiler).token.start;
            uVar5 = (vm->compiler).token.line;
            uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
            local_40->length = (vm->compiler).token.length;
            local_40->line = uVar5;
            *(undefined4 *)&local_40->field_0x1c = uVar6;
            local_40->type = TVar8;
            *(undefined4 *)&local_40->field_0x4 = uVar7;
            local_40->start = pcVar3;
            uVar6 = *(undefined4 *)&pTVar2->field_0x4;
            pcVar3 = (vm->compiler).next.start;
            sVar4 = (vm->compiler).next.length;
            uVar5 = (vm->compiler).next.line;
            uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
            (pCVar1->token).type = pTVar2->type;
            *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
            (vm->compiler).token.start = pcVar3;
            (vm->compiler).token.length = sVar4;
            (vm->compiler).token.line = uVar5;
            *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
            scan_token(&local_60,scanner);
            (vm->compiler).next.length = CONCAT44(local_60.length._4_4_,(undefined4)local_60.length)
            ;
            *(ulong *)&(vm->compiler).next.line = CONCAT44(local_60._28_4_,local_60.line);
            *(ulong *)pTVar2 = CONCAT44(local_60._4_4_,local_60.type);
            (vm->compiler).next.start = (char *)CONCAT44(local_60.start._4_4_,local_60.start._0_4_);
            expr(vm);
            instruction = instruction + '\x01';
          } while ((vm->compiler).token.type == TOKEN_COMMA);
        }
        consume(&local_60,vm,TOKEN_CLOSE_PAREN,"Expected \')\' after argument list");
        pTVar9 = local_40;
      }
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1c');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,instruction);
      TVar8 = (vm->compiler).token.type;
      scanner = local_38;
    } while (TVar8 == TOKEN_OPEN_PAREN);
  }
  if (TVar8 == TOKEN_STAR_STAR) {
    TVar8 = (pCVar1->token).type;
    uVar7 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar3 = (vm->compiler).token.start;
    uVar5 = (vm->compiler).token.line;
    uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    pTVar9->length = (vm->compiler).token.length;
    pTVar9->line = uVar5;
    *(undefined4 *)&pTVar9->field_0x1c = uVar6;
    pTVar9->type = TVar8;
    *(undefined4 *)&pTVar9->field_0x4 = uVar7;
    pTVar9->start = pcVar3;
    uVar6 = *(undefined4 *)&pTVar2->field_0x4;
    pcVar3 = (vm->compiler).next.start;
    sVar4 = (vm->compiler).next.length;
    uVar5 = (vm->compiler).next.line;
    uVar7 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = pTVar2->type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
    (vm->compiler).token.start = pcVar3;
    (vm->compiler).token.length = sVar4;
    (vm->compiler).token.line = uVar5;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar7;
    scan_token(&local_60,scanner);
    (vm->compiler).next.length = CONCAT44(local_60.length._4_4_,(undefined4)local_60.length);
    *(ulong *)&(vm->compiler).next.line = CONCAT44(local_60._28_4_,local_60.line);
    *(ulong *)pTVar2 = CONCAT44(local_60._4_4_,local_60.type);
    (vm->compiler).next.start = (char *)CONCAT44(local_60.start._4_4_,local_60.start._0_4_);
    factor(vm);
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\t');
  }
  return;
}

Assistant:

static void power(Vm *vm) {
    primary_expr(vm);

    if (match(vm, TOKEN_STAR_STAR)) {
        factor(vm);
        emit_no_arg(vm, OP_POW);
    }
}